

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_compare.hpp
# Opt level: O3

size_t jessilib::starts_with_lengthi<char,char>
                 (basic_string_view<char,_std::char_traits<char>_> in_string,
                 basic_string_view<char,_std::char_traits<char>_> in_prefix)

{
  char32_t cVar1;
  char *pcVar2;
  jessilib *pjVar3;
  char *pcVar5;
  char *pcVar6;
  jessilib *this;
  jessilib *this_00;
  basic_string_view<char,_std::char_traits<char>_> in_string_00;
  basic_string_view<char,_std::char_traits<char>_> in_string_01;
  decode_result dVar7;
  decode_result dVar8;
  char *local_50;
  size_t sVar4;
  
  pcVar6 = in_prefix._M_str;
  pjVar3 = (jessilib *)in_prefix._M_len;
  pcVar5 = in_string._M_str;
  this = (jessilib *)in_string._M_len;
  if (pjVar3 + -1 < this) {
    pcVar2 = (char *)0x0;
    this_00 = pjVar3;
    do {
      in_string_00._M_str = (char *)pjVar3;
      in_string_00._M_len = (size_t)pcVar5;
      dVar7 = decode_codepoint_utf8<char>(this,in_string_00);
      in_string_01._M_str = (char *)dVar7.units;
      in_string_01._M_len = (size_t)pcVar6;
      dVar8 = decode_codepoint_utf8<char>(this_00,in_string_01);
      sVar4 = dVar8.units;
      if (in_string_01._M_str == (char *)0x0) {
        return (size_t)(char *)0x0;
      }
      if (sVar4 == 0) {
        return (size_t)(char *)0x0;
      }
      if (dVar7.codepoint != dVar8.codepoint) {
        cVar1 = jessilib::fold(dVar7.codepoint);
        dVar8 = (decode_result)jessilib::fold(dVar8.codepoint);
        if (cVar1 != dVar8.codepoint) {
          return (size_t)(char *)0x0;
        }
      }
      pjVar3 = (jessilib *)dVar8.units;
      this_00 = this_00 + -sVar4;
      pcVar2 = pcVar2 + (long)in_string_01._M_str;
      this = this + -(long)in_string_01._M_str;
      if (this == (jessilib *)0x0) break;
      pcVar5 = pcVar5 + (long)in_string_01._M_str;
      pcVar6 = pcVar6 + sVar4;
    } while (this_00 != (jessilib *)0x0);
    local_50 = (char *)0x0;
    if (this_00 == (jessilib *)0x0) {
      local_50 = pcVar2;
    }
  }
  else {
    local_50 = (char *)0x0;
  }
  return (size_t)local_50;
}

Assistant:

size_t starts_with_lengthi(std::basic_string_view<LhsCharT> in_string, std::basic_string_view<RhsCharT> in_prefix) {
	// If in_string and in_prefix are the same type, skip decoding each point
	if constexpr (std::is_same_v<LhsCharT, RhsCharT>) {
		if (in_string.size() < in_prefix.size()) {
			return 0;
		}
	}

	size_t codepoints_removed{};
	while (!in_string.empty() && !in_prefix.empty()) {
		decode_result string_front = decode_codepoint(in_string);
		decode_result prefix_front = decode_codepoint(in_prefix);

		if (string_front.units == 0
			|| prefix_front.units == 0) {
			// Failed to decode front codepoint; bad unicode sequence
			return 0;
		}

		if (!equalsi(string_front.codepoint, prefix_front.codepoint)) {
			// Codepoints don't fold to same value
			return 0;
		}

		// Codepoints are equal; trim off the fronts and continue
		in_string.remove_prefix(string_front.units);
		in_prefix.remove_prefix(prefix_front.units);
		codepoints_removed += string_front.units;
	}

	if (!in_prefix.empty()) {
		// We reached end of in_string before end of prefix
		return 0;
	}

	return codepoints_removed;
}